

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::verifyResult
          (GetnUniformTest *this,void *inputData,void *resultData,int size,char *method)

{
  int iVar1;
  size_t sVar2;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  iVar1 = bcmp(inputData,resultData,(long)size);
  if (iVar1 != 0) {
    local_198 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,"Test failed! ",0xd);
    if (method == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
    }
    else {
      sVar2 = strlen(method);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,method,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190," result is not as expected.",0x1b);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
  }
  return iVar1 == 0;
}

Assistant:

bool GetnUniformTest::verifyResult(const void* inputData, const void* resultData, int size, const char* method)
{
	int diff = memcmp(inputData, resultData, size);
	if (diff != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " result is not as expected."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}